

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter_impl.hpp
# Opt level: O0

RawType dxil_spv::raw_component_type_to_type(ComponentType type)

{
  RawType local_c;
  ComponentType type_local;
  
  if ((((type == InternalU8) || (type == U16)) || (type == U32)) || (type == U64)) {
    local_c = Integer;
  }
  else {
    if (2 < (byte)(type - F16)) {
      __assert_fail("0 && \"Invalid component type.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/opcodes/converter_impl.hpp"
                    ,0x8d,"RawType dxil_spv::raw_component_type_to_type(DXIL::ComponentType)");
    }
    local_c = Float;
  }
  return local_c;
}

Assistant:

static inline RawType raw_component_type_to_type(DXIL::ComponentType type)
{
	switch (type)
	{
	case DXIL::ComponentType::InternalU8:
	case DXIL::ComponentType::U16:
	case DXIL::ComponentType::U32:
	case DXIL::ComponentType::U64:
		return RawType::Integer;
	case DXIL::ComponentType::F16:
	case DXIL::ComponentType::F32:
	case DXIL::ComponentType::F64:
		return RawType::Float;
	default:
		assert(0 && "Invalid component type.");
		return RawType::Count;
	}
}